

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O3

void fio_sock_packet_rotate_unsafe(uintptr_t fd)

{
  short *psVar1;
  long lVar2;
  long *ptr;
  fio_data_s *pfVar3;
  long lVar4;
  
  pfVar3 = fio_data;
  lVar4 = fd * 0xa8;
  ptr = *(long **)((long)fio_data + lVar4 + 0x40);
  *(long *)((long)fio_data + lVar4 + 0x40) = *ptr;
  LOCK();
  psVar1 = (short *)((long)pfVar3 + lVar4 + 0x68);
  *psVar1 = *psVar1 + -1;
  pfVar3 = fio_data;
  UNLOCK();
  lVar2 = (long)fio_data + lVar4 + 0x40;
  if (*ptr == 0) {
    *(long *)(lVar2 + 8) = lVar2;
    *(undefined2 *)((long)pfVar3 + lVar4 + 0x68) = 0;
  }
  else if (ptr == *(long **)(lVar2 + 8)) {
    *(long *)(lVar2 + 8) = lVar2;
  }
  (*(code *)ptr[2])(ptr[3]);
  fio_free(ptr);
  return;
}

Assistant:

static inline void fio_sock_packet_rotate_unsafe(uintptr_t fd) {
  fio_packet_s *packet = fd_data(fd).packet;
  fd_data(fd).packet = packet->next;
  fio_atomic_sub(&fd_data(fd).packet_count, 1);
  if (!packet->next) {
    fd_data(fd).packet_last = &fd_data(fd).packet;
    fd_data(fd).packet_count = 0;
  } else if (&packet->next == fd_data(fd).packet_last) {
    fd_data(fd).packet_last = &fd_data(fd).packet;
  }
  fio_packet_free(packet);
}